

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::ArticulatedPart::Encode(ArticulatedPart *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  ArticulatedPart *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_VariableParameter).m_ui8VarParamType);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8ParmeterChange);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16AttachementID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32ParamTypeVariant);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32ParamValue);
  KDataStream::operator<<(pKVar1,this->m_ui32Padding);
  return;
}

Assistant:

void ArticulatedPart::Encode( KDataStream & stream ) const
{
    stream << m_ui8VarParamType
           << m_ui8ParmeterChange
           << m_ui16AttachementID
           << m_ui32ParamTypeVariant
           << m_f32ParamValue
           << m_ui32Padding;
}